

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkedObjectFileCreation.cpp
# Opt level: O1

LinkedObjectFile *
to_linked_object_file
          (LinkedObjectFile *__return_storage_ptr__,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *data,string *name)

{
  undefined4 uVar1;
  undefined4 uVar2;
  byte bVar3;
  uchar uVar4;
  short sVar5;
  int *piVar6;
  long lVar7;
  byte bVar8;
  long lVar9;
  long lVar10;
  bool bVar11;
  bool bVar12;
  int iVar13;
  uint uVar14;
  int iVar15;
  uint dest_segment;
  int iVar16;
  uint32_t uVar17;
  long lVar18;
  ulong uVar19;
  Config *pCVar20;
  size_t sVar21;
  TypeInfo *pTVar22;
  ulong uVar23;
  uint uVar24;
  ulong uVar25;
  pointer puVar26;
  uint32_t *puVar27;
  uint uVar28;
  Kind kind;
  SymbolLinkKind SVar29;
  ulong uVar30;
  uint uVar31;
  ulong uVar32;
  pointer puVar33;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvVar34;
  uint uVar35;
  int *piVar36;
  uint32_t segment_link_offsets [3];
  uint32_t segment_data_offsets [3];
  uint32_t segment_link_ends [3];
  allocator local_b1;
  ulong local_b0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_a8;
  size_t local_a0;
  string local_98;
  string *local_78;
  uint local_70 [6];
  int *local_58;
  uint32_t local_4c [3];
  int *local_40;
  int *local_38;
  
  *(undefined1 (*) [16])&(__return_storage_ptr__->stats).decoded_ops = (undefined1  [16])0x0;
  (__return_storage_ptr__->stats).data_bytes = 0;
  (__return_storage_ptr__->stats).code_bytes = 0;
  (__return_storage_ptr__->stats).function_count = 0;
  (__return_storage_ptr__->stats).decoded_ops = 0;
  (__return_storage_ptr__->stats).v3_link_bytes = 0;
  (__return_storage_ptr__->stats).v3_symbol_count = 0;
  (__return_storage_ptr__->stats).v3_symbol_link_offset = 0;
  (__return_storage_ptr__->stats).v3_symbol_link_word = 0;
  (__return_storage_ptr__->stats).v3_pointers = 0;
  (__return_storage_ptr__->stats).v3_split_pointers = 0;
  (__return_storage_ptr__->stats).v3_word_pointers = 0;
  (__return_storage_ptr__->stats).v3_pointer_seeks = 0;
  (__return_storage_ptr__->stats).total_v2_link_bytes = 0;
  (__return_storage_ptr__->stats).total_v2_symbol_links = 0;
  (__return_storage_ptr__->stats).total_v2_symbol_count = 0;
  (__return_storage_ptr__->stats).v3_code_bytes = 0;
  (__return_storage_ptr__->stats).total_code_bytes = 0;
  (__return_storage_ptr__->stats).total_v2_code_bytes = 0;
  (__return_storage_ptr__->stats).total_v2_pointers = 0;
  (__return_storage_ptr__->stats).total_v2_pointer_seeks = 0;
  (__return_storage_ptr__->words_by_seg).
  super__Vector_base<std::vector<LinkedWord,_std::allocator<LinkedWord>_>,_std::allocator<std::vector<LinkedWord,_std::allocator<LinkedWord>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->words_by_seg).
  super__Vector_base<std::vector<LinkedWord,_std::allocator<LinkedWord>_>,_std::allocator<std::vector<LinkedWord,_std::allocator<LinkedWord>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined1 (*) [16])
   &(__return_storage_ptr__->words_by_seg).
    super__Vector_base<std::vector<LinkedWord,_std::allocator<LinkedWord>_>,_std::allocator<std::vector<LinkedWord,_std::allocator<LinkedWord>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (undefined1  [16])0x0;
  (__return_storage_ptr__->offset_of_data_zone_by_seg).
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (__return_storage_ptr__->offset_of_data_zone_by_seg).
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->functions_by_seg).
  super__Vector_base<std::vector<Function,_std::allocator<Function>_>,_std::allocator<std::vector<Function,_std::allocator<Function>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->functions_by_seg).
  super__Vector_base<std::vector<Function,_std::allocator<Function>_>,_std::allocator<std::vector<Function,_std::allocator<Function>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined1 (*) [16])
   &(__return_storage_ptr__->functions_by_seg).
    super__Vector_base<std::vector<Function,_std::allocator<Function>_>,_std::allocator<std::vector<Function,_std::allocator<Function>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (undefined1  [16])0x0;
  (__return_storage_ptr__->labels).super__Vector_base<Label,_std::allocator<Label>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->labels).super__Vector_base<Label,_std::allocator<Label>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->label_per_seg_by_offset).
  super__Vector_base<std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>,_std::allocator<std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->label_per_seg_by_offset).
  super__Vector_base<std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>,_std::allocator<std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->label_per_seg_by_offset).
  super__Vector_base<std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>,_std::allocator<std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  piVar6 = (int *)(data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                  super__Vector_impl_data._M_start;
  piVar36 = (int *)(data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
                   .super__Vector_impl_data._M_finish;
  uVar25 = (long)piVar36 - (long)piVar6;
  local_78 = name;
  if (uVar25 == 0) {
LAB_0012d721:
    uVar23 = 0;
  }
  else {
    sVar5 = (short)piVar6[2];
    local_a8 = data;
    if (sVar5 == 5) {
      if (piVar36 != piVar6) {
        if ((char)piVar6[5] == '\x01') {
          printf("abandon %s!\n",(name->_M_dataplus)._M_p);
        }
        else {
          if (*piVar6 != 0) {
            __assert_fail("header->type_tag == 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/LinkedObjectFileCreation.cpp"
                          ,0x18a,
                          "void link_v5(LinkedObjectFile &, const std::vector<uint8_t> &, const std::string &)"
                         );
          }
          iVar13 = std::__cxx11::string::compare((char *)name);
          if (iVar13 != 0) {
            __assert_fail("name == header->name",
                          "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/LinkedObjectFileCreation.cpp"
                          ,0x18b,
                          "void link_v5(LinkedObjectFile &, const std::vector<uint8_t> &, const std::string &)"
                         );
          }
          if ((char)piVar6[5] != '\x03') {
            __assert_fail("header->n_segments == 3",
                          "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/LinkedObjectFileCreation.cpp"
                          ,0x18c,
                          "void link_v5(LinkedObjectFile &, const std::vector<uint8_t> &, const std::string &)"
                         );
          }
          if (piVar6[3] != 0x50) {
            __assert_fail("header->pad == 0x50",
                          "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/LinkedObjectFileCreation.cpp"
                          ,0x18d,
                          "void link_v5(LinkedObjectFile &, const std::vector<uint8_t> &, const std::string &)"
                         );
          }
          if (piVar6[1] - piVar6[4] != 0x50) {
            __assert_fail("header->length_to_get_to_code - header->link_length == 0x50",
                          "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/LinkedObjectFileCreation.cpp"
                          ,0x18e,
                          "void link_v5(LinkedObjectFile &, const std::vector<uint8_t> &, const std::string &)"
                         );
          }
          LinkedObjectFile::set_segment_count(__return_storage_ptr__,3);
          iVar13 = piVar6[1];
          piVar36 = piVar6 + 0x14;
          lVar18 = 0;
          do {
            *(int *)((long)local_70 + lVar18 + 0xc) = piVar6[lVar18 + 0x15] + iVar13;
            *(int *)((long)local_70 + lVar18) = piVar36[lVar18] + 0x50;
            if (piVar6[lVar18 + 0x17] != 1) {
              __assert_fail("header->segment_info[i].magic == 1",
                            "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/LinkedObjectFileCreation.cpp"
                            ,0x1a6,
                            "void link_v5(LinkedObjectFile &, const std::vector<uint8_t> &, const std::string &)"
                           );
            }
            lVar18 = lVar18 + 4;
          } while (lVar18 != 0xc);
          lVar18 = 0;
          while (lVar18 != 8) {
            lVar9 = lVar18 + 0xc;
            lVar7 = lVar18 + 0x16;
            lVar10 = lVar18 + 0x10;
            lVar18 = lVar18 + 4;
            if ((*(int *)((long)local_70 + lVar9) + piVar6[lVar7] + 0xfU & 0xfffffff0) !=
                *(uint *)((long)local_70 + lVar10)) {
              __assert_fail("align16(segment_data_offsets[i] + header->segment_info[i].size) == segment_data_offsets[i + 1]"
                            ,
                            "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/LinkedObjectFileCreation.cpp"
                            ,0x1ac,
                            "void link_v5(LinkedObjectFile &, const std::vector<uint8_t> &, const std::string &)"
                           );
            }
          }
          local_40 = piVar6;
          if ((long)(local_a8->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(local_a8->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                    _M_impl.super__Vector_impl_data._M_start !=
              (ulong)(local_70[5] + piVar6[0x1e] + 0xf & 0xfffffff0)) {
            __assert_fail("align16(segment_data_offsets[2] + header->segment_info[2].size) == data.size()"
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/LinkedObjectFileCreation.cpp"
                          ,0x1ae,
                          "void link_v5(LinkedObjectFile &, const std::vector<uint8_t> &, const std::string &)"
                         );
          }
          uVar32 = 2;
          local_58 = piVar36;
          pvVar34 = local_a8;
          do {
            uVar28 = piVar36[uVar32 * 4 + 2];
            if (uVar28 != 0) {
              puVar27 = &(__return_storage_ptr__->stats).v3_code_bytes;
              *puVar27 = *puVar27 + uVar28;
              uVar35 = uVar28;
              bVar12 = false;
              do {
                bVar11 = bVar12;
                uVar31 = uVar35 & 3;
                uVar35 = uVar35 + 1;
                bVar12 = true;
              } while (uVar31 != 0);
              if (bVar11) {
                printf("Adjusted the size of segment %d in %s, this is fine, but rare (and may indicate a bigger problem if it happens often)\n"
                       ,uVar32 & 0xffffffff,(local_78->_M_dataplus)._M_p);
              }
              uVar35 = local_70[uVar32 + 3];
              uVar19 = (ulong)uVar35;
              if ((uVar35 & 3) != 0) {
                __assert_fail("(data_ptr % 4) == 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/LinkedObjectFileCreation.cpp"
                              ,0x1cc,
                              "void link_v5(LinkedObjectFile &, const std::vector<uint8_t> &, const std::string &)"
                             );
              }
              puVar26 = (pvVar34->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)
                        ._M_impl.super__Vector_impl_data._M_start;
              uVar25 = (long)(pvVar34->
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                             _M_impl.super__Vector_impl_data._M_finish - (long)puVar26;
              uVar23 = uVar19;
              if (uVar25 <= uVar19) goto LAB_0012d58d;
              uVar31 = uVar35 - 4;
              uVar23 = (ulong)((-uVar28 & 3) + uVar28 + uVar31);
              if (uVar25 <= uVar23) goto LAB_0012d58d;
              uVar28 = local_70[uVar32];
              uVar30 = (ulong)uVar28;
              if (puVar26 + uVar19 < puVar26 + uVar23 + 4) {
                puVar33 = puVar26 + (uVar19 - 4);
                do {
                  LinkedObjectFile::push_back_word_to_segment
                            (__return_storage_ptr__,*(uint32_t *)(puVar33 + 4),(int)uVar32);
                  puVar33 = puVar33 + 4;
                } while (puVar33 < puVar26 + uVar23);
              }
              pvVar34 = local_a8;
              puVar26 = (local_a8->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                        )._M_impl.super__Vector_impl_data._M_start;
              uVar25 = (long)(local_a8->
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                             _M_impl.super__Vector_impl_data._M_finish - (long)puVar26;
              uVar23 = uVar30;
              if (uVar25 <= uVar30) goto LAB_0012d58d;
              local_b0 = uVar32;
              if (puVar26[uVar30] != '\0') {
                uVar28 = 0;
                do {
                  puVar26 = (pvVar34->
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                            _M_impl.super__Vector_impl_data._M_start;
                  uVar25 = (long)(pvVar34->
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                                 _M_impl.super__Vector_impl_data._M_finish - (long)puVar26;
                  local_a0 = CONCAT44(local_a0._4_4_,uVar28);
                  uVar23 = uVar30;
                  if ((uVar28 & 1) == 0) {
                    if (uVar25 <= uVar30) goto LAB_0012d58d;
                    uVar31 = uVar31 + (uint)puVar26[uVar30] * 4;
                    puVar27 = &(__return_storage_ptr__->stats).v3_pointer_seeks;
                    *puVar27 = *puVar27 + 1;
                  }
                  else {
                    if (uVar25 <= uVar30) goto LAB_0012d58d;
                    uVar28 = 0xffffffff;
                    while (uVar28 = uVar28 + 1, uVar28 < puVar26[uVar30]) {
                      puVar27 = &(__return_storage_ptr__->stats).v3_pointers;
                      *puVar27 = *puVar27 + 1;
                      uVar23 = (ulong)uVar31;
                      if (uVar25 <= uVar23) goto LAB_0012d58d;
                      uVar24 = *(uint *)(puVar26 + uVar23);
                      iVar13 = (int)local_b0;
                      if (uVar24 < 0x1000000) {
                        puVar27 = &(__return_storage_ptr__->stats).v3_word_pointers;
                        *puVar27 = *puVar27 + 1;
                        bVar12 = LinkedObjectFile::pointer_link_word
                                           (__return_storage_ptr__,iVar13,-uVar35 + uVar31,iVar13,
                                            uVar24);
                        if (!bVar12) {
                          printf("WARNING bad pointer_link_word (2) in %s\n",
                                 (local_78->_M_dataplus)._M_p);
                        }
                      }
                      else {
                        puVar27 = &(__return_storage_ptr__->stats).v3_split_pointers;
                        *puVar27 = *puVar27 + 1;
                        uVar14 = uVar24 >> 0xc & 0xf;
                        if (uVar14 == 0) {
                          __assert_fail("lo_hi_offset",
                                        "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/LinkedObjectFileCreation.cpp"
                                        ,0x1ec,
                                        "void link_v5(LinkedObjectFile &, const std::vector<uint8_t> &, const std::string &)"
                                       );
                        }
                        dest_segment = uVar24 >> 8 & 0xf;
                        if (2 < dest_segment) {
                          __assert_fail("dest_seg < 3",
                                        "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/LinkedObjectFileCreation.cpp"
                                        ,0x1ed,
                                        "void link_v5(LinkedObjectFile &, const std::vector<uint8_t> &, const std::string &)"
                                       );
                        }
                        uVar23 = (ulong)(uVar31 + uVar14 * 4);
                        if (uVar25 <= uVar23) goto LAB_0012d58d;
                        iVar15 = -uVar35 + uVar31;
                        LinkedObjectFile::pointer_link_split_word
                                  (__return_storage_ptr__,iVar13,iVar15,uVar14 * 4 + iVar15,
                                   dest_segment,
                                   (uVar24 & 0xff) << 0x10 | (uint)*(ushort *)(puVar26 + uVar23));
                      }
                      uVar31 = uVar31 + 4;
                      puVar26 = (pvVar34->
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                                _M_impl.super__Vector_impl_data._M_start;
                      uVar25 = (long)(pvVar34->
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     )._M_impl.super__Vector_impl_data._M_finish - (long)puVar26;
                      uVar23 = uVar30;
                      if (uVar25 <= uVar30) goto LAB_0012d58d;
                    }
                  }
                  puVar26 = (pvVar34->
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                            _M_impl.super__Vector_impl_data._M_start;
                  uVar25 = (long)(pvVar34->
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                                 _M_impl.super__Vector_impl_data._M_finish - (long)puVar26;
                  uVar23 = uVar30;
                  if (uVar25 <= uVar30) goto LAB_0012d58d;
                  uVar28 = (int)uVar30 + 1;
                  uVar23 = (ulong)uVar28;
                  if (puVar26[uVar30] == 0xff) {
                    if (uVar25 <= uVar23) goto LAB_0012d58d;
                    bVar12 = puVar26[uVar23] == '\0';
                    if (bVar12) {
                      uVar23 = (ulong)((int)uVar30 + 2);
                    }
                  }
                  else {
                    if (uVar25 <= uVar23) goto LAB_0012d58d;
                    bVar12 = true;
                    if (puVar26[uVar23] == '\0') break;
                  }
                  uVar28 = CONCAT31((int3)(local_a0 >> 8),(byte)local_a0 ^ bVar12);
                  uVar30 = uVar23;
                } while( true );
              }
              uVar32 = local_b0;
              uVar17 = uVar28 + 1;
              uVar19 = (ulong)uVar17;
              puVar26 = (pvVar34->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)
                        ._M_impl.super__Vector_impl_data._M_start;
              uVar25 = (long)(pvVar34->
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                             _M_impl.super__Vector_impl_data._M_finish - (long)puVar26;
              uVar23 = uVar19;
              if (uVar25 <= uVar19) goto LAB_0012d58d;
              uVar4 = puVar26[uVar19];
              piVar36 = local_58;
              while (local_58 = piVar36, uVar4 != '\0') {
                puVar26 = (pvVar34->
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
                          .super__Vector_impl_data._M_start;
                uVar25 = (long)(pvVar34->
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                               _M_impl.super__Vector_impl_data._M_finish - (long)puVar26;
                uVar23 = uVar19;
                if (uVar25 <= uVar19) goto LAB_0012d58d;
                iVar13 = (int)uVar19;
                if ((char)puVar26[uVar19] < '\0') {
                  if ((~puVar26[uVar19] & 0x3f) == 0) {
                    __assert_fail("false",
                                  "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/LinkedObjectFileCreation.cpp"
                                  ,0x225,
                                  "void link_v5(LinkedObjectFile &, const std::vector<uint8_t> &, const std::string &)"
                                 );
                  }
                  uVar23 = (ulong)(iVar13 + 3);
                  if (uVar25 <= uVar23) goto LAB_0012d58d;
                  puVar26 = puVar26 + uVar23;
                  sVar21 = strlen((char *)puVar26);
                  iVar15 = (int)sVar21;
                  SVar29 = TYPE;
                }
                else {
                  uVar23 = (ulong)(iVar13 + 3);
                  if (uVar25 <= uVar23) goto LAB_0012d58d;
                  puVar26 = puVar26 + uVar23;
                  local_a0 = strlen((char *)puVar26);
                  local_98.field_2._M_allocated_capacity._0_4_ = 0x706d655f;
                  local_98._M_string_length = 7;
                  local_98.field_2._M_allocated_capacity._4_4_ = 0x5f7974;
                  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
                  iVar16 = std::__cxx11::string::compare((char *)&local_98);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_98._M_dataplus._M_p != &local_98.field_2) {
                    operator_delete(local_98._M_dataplus._M_p,
                                    CONCAT44(local_98.field_2._M_allocated_capacity._4_4_,
                                             local_98.field_2._M_allocated_capacity._0_4_) + 1);
                  }
                  iVar15 = (int)local_a0;
                  SVar29 = (uint)(iVar16 != 0) * 2;
                }
                uVar17 = c_symlink2(__return_storage_ptr__,pvVar34,uVar35,iVar13 + iVar15 + 4,SVar29
                                    ,(char *)puVar26,(int)uVar32);
                uVar19 = (ulong)uVar17;
                uVar23 = (ulong)uVar17;
                puVar26 = (pvVar34->
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
                          .super__Vector_impl_data._M_start;
                uVar25 = (long)(pvVar34->
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                               _M_impl.super__Vector_impl_data._M_finish - (long)puVar26;
                if (uVar25 <= uVar23) goto LAB_0012d58d;
                piVar36 = local_58;
                uVar4 = puVar26[uVar23];
              }
              local_4c[uVar32] = uVar17;
            }
            bVar12 = uVar32 != 0;
            uVar32 = uVar32 - 1;
          } while (bVar12);
          if (local_70[0] != 0x80) {
            __assert_fail("segment_link_offsets[0] == 128",
                          "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/LinkedObjectFileCreation.cpp"
                          ,0x23b,
                          "void link_v5(LinkedObjectFile &, const std::vector<uint8_t> &, const std::string &)"
                         );
          }
          if (local_40[0x16] == 0) {
            if (local_70[1] != 0x82) {
              __assert_fail("segment_link_offsets[0] + 2 == segment_link_offsets[1]",
                            "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/LinkedObjectFileCreation.cpp"
                            ,0x240,
                            "void link_v5(LinkedObjectFile &, const std::vector<uint8_t> &, const std::string &)"
                           );
            }
          }
          else if (local_4c[0] + 1 != local_70[1]) {
            __assert_fail("segment_link_ends[0] + 1 == segment_link_offsets[1]",
                          "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/LinkedObjectFileCreation.cpp"
                          ,0x23e,
                          "void link_v5(LinkedObjectFile &, const std::vector<uint8_t> &, const std::string &)"
                         );
          }
          if (local_40[0x1a] == 0) {
            if (local_70[1] + 2 != local_70[2]) {
              __assert_fail("segment_link_offsets[1] + 2 == segment_link_offsets[2]",
                            "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/LinkedObjectFileCreation.cpp"
                            ,0x246,
                            "void link_v5(LinkedObjectFile &, const std::vector<uint8_t> &, const std::string &)"
                           );
            }
          }
          else if (local_4c[1] + 1 != local_70[2]) {
            __assert_fail("segment_link_ends[1] + 1 == segment_link_offsets[2]",
                          "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/LinkedObjectFileCreation.cpp"
                          ,0x244,
                          "void link_v5(LinkedObjectFile &, const std::vector<uint8_t> &, const std::string &)"
                         );
          }
          if ((local_4c[2] + 0x11 & 0xfffffff0) != local_70[3]) {
            __assert_fail("align16(segment_link_ends[2] + 2) == segment_data_offsets[0]",
                          "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/LinkedObjectFileCreation.cpp"
                          ,0x249,
                          "void link_v5(LinkedObjectFile &, const std::vector<uint8_t> &, const std::string &)"
                         );
          }
        }
        return __return_storage_ptr__;
      }
    }
    else {
      if (sVar5 == 4) {
        if (*piVar6 != -1) {
          __assert_fail("header->type_tag == 0xffffffff",
                        "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/LinkedObjectFileCreation.cpp"
                        ,0x314,
                        "LinkedObjectFile to_linked_object_file(const std::vector<uint8_t> &, const std::string &)"
                       );
        }
        if (piVar36 != piVar6) {
          iVar13 = piVar6[3];
          uVar1 = (__return_storage_ptr__->stats).total_code_bytes;
          uVar2 = (__return_storage_ptr__->stats).total_v2_code_bytes;
          (__return_storage_ptr__->stats).total_code_bytes = iVar13 + uVar1;
          (__return_storage_ptr__->stats).total_v2_code_bytes = iVar13 + uVar2;
          if (uVar25 < 0x11) {
            uVar23 = 0x10;
          }
          else {
            uVar28 = iVar13 + 0x10;
            uVar32 = (ulong)uVar28;
            uVar23 = uVar32;
            if (uVar32 < uVar25) {
              if ((uVar28 & 3) != 0) {
                __assert_fail("((code_end - code_start) % 4) == 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/LinkedObjectFileCreation.cpp"
                              ,0xf3,
                              "void link_v4(LinkedObjectFile &, const std::vector<uint8_t> &, const std::string &)"
                             );
              }
              LinkedObjectFile::set_segment_count(__return_storage_ptr__,1);
              local_a0 = CONCAT44(local_a0._4_4_,uVar28);
              if (0x10 < uVar28) {
                puVar27 = (uint32_t *)(piVar6 + 4);
                do {
                  LinkedObjectFile::push_back_word_to_segment(__return_storage_ptr__,*puVar27,0);
                  puVar27 = puVar27 + 1;
                } while (puVar27 < (uint32_t *)(uVar32 + (long)piVar6));
              }
              piVar36 = (int *)(local_a8->
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                               _M_impl.super__Vector_impl_data._M_start;
              uVar25 = (long)(local_a8->
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                             _M_impl.super__Vector_impl_data._M_finish - (long)piVar36;
              if (uVar32 < uVar25) {
                if (*(int *)((long)piVar36 + uVar32) != -1) {
                  __assert_fail("link_header_v2->type_tag == 0xffffffff",
                                "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/LinkedObjectFileCreation.cpp"
                                ,0xfc,
                                "void link_v4(LinkedObjectFile &, const std::vector<uint8_t> &, const std::string &)"
                               );
                }
                if (*(int *)((long)piVar36 + uVar32 + 8) != 2) {
                  __assert_fail("link_header_v2->version == 2",
                                "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/LinkedObjectFileCreation.cpp"
                                ,0xfd,
                                "void link_v4(LinkedObjectFile &, const std::vector<uint8_t> &, const std::string &)"
                               );
                }
                iVar15 = *(int *)((long)piVar36 + uVar32 + 4);
                if (iVar15 != piVar6[1]) {
                  __assert_fail("link_header_v2->length == header->length",
                                "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/LinkedObjectFileCreation.cpp"
                                ,0xfe,
                                "void link_v4(LinkedObjectFile &, const std::vector<uint8_t> &, const std::string &)"
                               );
                }
                puVar27 = &(__return_storage_ptr__->stats).total_v2_link_bytes;
                *puVar27 = *puVar27 + iVar15;
                uVar19 = (ulong)(iVar13 + 0x1c);
                uVar23 = uVar19;
                if (uVar19 < uVar25) {
                  local_58 = piVar36;
                  if (*(char *)((long)piVar36 + uVar19) == '\0') {
                    uVar23 = (ulong)(iVar13 + 0x1d);
                    pvVar34 = local_a8;
                  }
                  else {
                    uVar28 = 0x10;
                    bVar12 = false;
                    do {
                      do {
                        puVar26 = (local_a8->
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)
                                  ._M_impl.super__Vector_impl_data._M_start;
                        uVar25 = (long)(local_a8->
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       )._M_impl.super__Vector_impl_data._M_finish - (long)puVar26;
                        uVar23 = uVar19;
                        if (uVar25 <= uVar19) goto LAB_0012d58d;
                        bVar3 = puVar26[uVar19];
                        bVar8 = bVar3;
                        if (bVar12) {
                          for (; bVar8 != 0; bVar8 = bVar8 - 1) {
                            uVar23 = (ulong)uVar28;
                            puVar26 = (local_a8->
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      )._M_impl.super__Vector_impl_data._M_start;
                            uVar25 = (long)(local_a8->
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           )._M_impl.super__Vector_impl_data._M_finish -
                                     (long)puVar26;
                            if (uVar25 <= uVar23) goto LAB_0012d58d;
                            bVar11 = LinkedObjectFile::pointer_link_word
                                               (__return_storage_ptr__,0,uVar28 - 0x10,0,
                                                *(int *)(puVar26 + uVar23));
                            if (!bVar11) {
                              printf("WARNING bad link in %s\n");
                            }
                            puVar27 = &(__return_storage_ptr__->stats).total_v2_pointers;
                            *puVar27 = *puVar27 + 1;
                            uVar28 = uVar28 + 4;
                          }
                        }
                        else {
                          uVar28 = uVar28 + (uint)bVar3 * 4;
                          puVar27 = &(__return_storage_ptr__->stats).total_v2_pointer_seeks;
                          *puVar27 = *puVar27 + 1;
                        }
                        uVar35 = (int)uVar19 + 1;
                        if (bVar3 == 0xff) {
                          uVar23 = (ulong)uVar35;
                          puVar26 = (local_a8->
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    )._M_impl.super__Vector_impl_data._M_start;
                          uVar25 = (long)(local_a8->
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         )._M_impl.super__Vector_impl_data._M_finish - (long)puVar26
                          ;
                          if (uVar25 <= uVar23) goto LAB_0012d58d;
                          bVar11 = puVar26[uVar23] == '\0';
                          if (bVar11) {
                            uVar35 = (int)uVar19 + 2;
                          }
                          bVar12 = (bool)(bVar12 ^ bVar11);
                        }
                        uVar19 = (ulong)uVar35;
                      } while (bVar3 == 0xff);
                      puVar26 = (local_a8->
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                                _M_impl.super__Vector_impl_data._M_start;
                      uVar25 = (long)(local_a8->
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     )._M_impl.super__Vector_impl_data._M_finish - (long)puVar26;
                      uVar23 = uVar19;
                      if (uVar25 <= uVar19) goto LAB_0012d58d;
                      bVar12 = (bool)(bVar12 ^ 1);
                    } while (puVar26[uVar19] != '\0');
                    uVar23 = (ulong)(uVar35 + 1);
                    pvVar34 = local_a8;
                  }
                  while( true ) {
                    uVar28 = (uint)uVar23;
                    puVar26 = (pvVar34->
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                              _M_impl.super__Vector_impl_data._M_start;
                    uVar25 = (long)(pvVar34->
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   )._M_impl.super__Vector_impl_data._M_finish - (long)puVar26;
                    if (uVar25 <= uVar23) break;
                    if (puVar26[uVar23] == '\0') {
                      if (*(int *)((long)local_58 + uVar32 + 4) !=
                          (uVar28 - (int)local_a0 & 0xffffffc0) + 0x40) {
                        __assert_fail("link_header_v2->length == align64(link_ptr_offset - link_data_offset + 1)"
                                      ,
                                      "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/LinkedObjectFileCreation.cpp"
                                      ,0x171,
                                      "void link_v4(LinkedObjectFile &, const std::vector<uint8_t> &, const std::string &)"
                                     );
                      }
                      puVar26 = (pvVar34->
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                                _M_impl.super__Vector_impl_data._M_start;
                      while( true ) {
                        if ((ulong)((long)(pvVar34->
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          )._M_impl.super__Vector_impl_data._M_finish -
                                   (long)puVar26) <= uVar23) {
                          return __return_storage_ptr__;
                        }
                        uVar28 = uVar28 + 1;
                        if (puVar26[uVar23] != '\0') break;
                        uVar23 = (ulong)uVar28;
                      }
                      __assert_fail("data.at(link_ptr_offset) == 0",
                                    "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/LinkedObjectFileCreation.cpp"
                                    ,0x173,
                                    "void link_v4(LinkedObjectFile &, const std::vector<uint8_t> &, const std::string &)"
                                   );
                    }
                    puVar26 = (pvVar34->
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                              _M_impl.super__Vector_impl_data._M_start;
                    uVar25 = (long)(pvVar34->
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   )._M_impl.super__Vector_impl_data._M_finish - (long)puVar26;
                    if (uVar25 <= uVar23) break;
                    bVar3 = puVar26[uVar23];
                    if ((char)bVar3 < '\0') {
                      uVar28 = uVar28 + 1;
                      uVar23 = (ulong)uVar28;
                      if (uVar25 <= uVar23) break;
                      if ((bVar3 & 0x7f) != 0) {
                        __assert_fail("false",
                                      "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/LinkedObjectFileCreation.cpp"
                                      ,0x15f,
                                      "void link_v4(LinkedObjectFile &, const std::vector<uint8_t> &, const std::string &)"
                                     );
                      }
                      local_b0 = CONCAT44(local_b0._4_4_,1);
                    }
                    else {
                      if (bVar3 < 10) {
                        __assert_fail("false",
                                      "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/LinkedObjectFileCreation.cpp"
                                      ,0x14c,
                                      "void link_v4(LinkedObjectFile &, const std::vector<uint8_t> &, const std::string &)"
                                     );
                      }
                      local_b0 = CONCAT44(local_b0._4_4_,2);
                    }
                    local_98.field_2._M_allocated_capacity._0_4_ = 0x706d655f;
                    local_98._M_string_length = 7;
                    local_98.field_2._M_allocated_capacity._4_4_ = 0x5f7974;
                    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
                    iVar13 = std::__cxx11::string::compare((char *)&local_98);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_98._M_dataplus._M_p != &local_98.field_2) {
                      operator_delete(local_98._M_dataplus._M_p,
                                      CONCAT44(local_98.field_2._M_allocated_capacity._4_4_,
                                               local_98.field_2._M_allocated_capacity._0_4_) + 1);
                    }
                    if (((char)bVar3 < '\0') && (iVar13 == 0)) {
                      __assert_fail("kind == SymbolLinkKind::SYMBOL",
                                    "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/LinkedObjectFileCreation.cpp"
                                    ,0x164,
                                    "void link_v4(LinkedObjectFile &, const std::vector<uint8_t> &, const std::string &)"
                                   );
                    }
                    SVar29 = (SymbolLinkKind)local_b0;
                    if (iVar13 == 0) {
                      SVar29 = EMPTY_LIST;
                    }
                    sVar21 = strlen((char *)(puVar26 + uVar23));
                    pvVar34 = local_a8;
                    puVar27 = &(__return_storage_ptr__->stats).total_v2_symbol_count;
                    *puVar27 = *puVar27 + 1;
                    uVar17 = c_symlink2(__return_storage_ptr__,local_a8,0x10,
                                        uVar28 + (int)sVar21 + 1,SVar29,(char *)(puVar26 + uVar23),0
                                       );
                    uVar23 = (ulong)uVar17;
                  }
                }
              }
            }
          }
          goto LAB_0012d58d;
        }
        goto LAB_0012d721;
      }
      if (sVar5 != 3) {
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/LinkedObjectFileCreation.cpp"
                      ,0x319,
                      "LinkedObjectFile to_linked_object_file(const std::vector<uint8_t> &, const std::string &)"
                     );
      }
      if (*piVar6 != 0) {
        __assert_fail("header->type_tag == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/LinkedObjectFileCreation.cpp"
                      ,0x311,
                      "LinkedObjectFile to_linked_object_file(const std::vector<uint8_t> &, const std::string &)"
                     );
      }
      if (piVar36 != piVar6) {
        iVar13 = std::__cxx11::string::compare((char *)name);
        if (iVar13 != 0) {
          __assert_fail("name == header->name",
                        "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/LinkedObjectFileCreation.cpp"
                        ,0x250,
                        "void link_v3(LinkedObjectFile &, const std::vector<uint8_t> &, const std::string &)"
                       );
        }
        if (piVar6[3] != 3) {
          __assert_fail("header->segments == 3",
                        "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/LinkedObjectFileCreation.cpp"
                        ,0x251,
                        "void link_v3(LinkedObjectFile &, const std::vector<uint8_t> &, const std::string &)"
                       );
        }
        LinkedObjectFile::set_segment_count(__return_storage_ptr__,3);
        lVar18 = -1;
        do {
          lVar7 = lVar18 + 0x11;
          lVar18 = lVar18 + 1;
        } while (*(char *)((long)piVar6 + lVar7) != '\0');
        for (; lVar18 < 0x40; lVar18 = lVar18 + 1) {
          if (*(char *)((long)piVar6 + lVar18 + 0x10) != '\0') {
            __assert_fail("!*ptr",
                          "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/LinkedObjectFileCreation.cpp"
                          ,0x17d,"void assert_string_empty_after(const char *, int)");
          }
        }
        local_38 = piVar6 + 0x14;
        lVar18 = 0;
        do {
          if (*(int *)((long)piVar6 + lVar18 + 0x5c) != 0) {
            __assert_fail("header->segment_info[i].magic == 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/LinkedObjectFileCreation.cpp"
                          ,599,
                          "void link_v3(LinkedObjectFile &, const std::vector<uint8_t> &, const std::string &)"
                         );
          }
          lVar18 = lVar18 + 0x10;
        } while (lVar18 != 0x30);
        iVar13 = piVar6[1];
        puVar27 = &(__return_storage_ptr__->stats).v3_link_bytes;
        *puVar27 = *puVar27 + iVar13;
        lVar18 = 0;
        do {
          *(int *)((long)local_70 + lVar18 + 0xc) = piVar6[lVar18 + 0x15] + iVar13;
          *(int *)((long)local_70 + lVar18) = piVar6[lVar18 + 0x14];
          lVar18 = lVar18 + 4;
        } while (lVar18 != 0xc);
        lVar18 = 0;
        while (lVar18 != 8) {
          lVar9 = lVar18 + 0xc;
          lVar7 = lVar18 + 0x16;
          lVar10 = lVar18 + 0x10;
          lVar18 = lVar18 + 4;
          if ((*(int *)((long)local_70 + lVar9) + piVar6[lVar7] + 0xfU & 0xfffffff0) !=
              *(uint *)((long)local_70 + lVar10)) {
            __assert_fail("align16(segment_data_offsets[i] + header->segment_info[i].size) == segment_data_offsets[i + 1]"
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/LinkedObjectFileCreation.cpp"
                          ,0x26b,
                          "void link_v3(LinkedObjectFile &, const std::vector<uint8_t> &, const std::string &)"
                         );
          }
        }
        local_40 = piVar6;
        if ((long)(local_a8->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)(local_a8->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                  _M_impl.super__Vector_impl_data._M_start !=
            (ulong)(local_70[5] + piVar6[0x1e] + 0xf & 0xfffffff0)) {
          __assert_fail("align16(segment_data_offsets[2] + header->segment_info[2].size) == data.size()"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/LinkedObjectFileCreation.cpp"
                        ,0x26d,
                        "void link_v3(LinkedObjectFile &, const std::vector<uint8_t> &, const std::string &)"
                       );
        }
        uVar32 = 2;
        pvVar34 = local_a8;
        do {
          uVar28 = local_38[uVar32 * 4 + 2];
          uVar25 = uVar32;
          if (uVar28 != 0) {
            puVar27 = &(__return_storage_ptr__->stats).v3_code_bytes;
            *puVar27 = *puVar27 + uVar28;
            pCVar20 = get_config();
            if (pCVar20->game_version == 1) {
              iVar13 = std::__cxx11::string::compare((char *)local_78);
              uVar28 = uVar28 + ((int)uVar32 == 0 && iVar13 == 0);
            }
            pCVar20 = get_config();
            if (pCVar20->game_version == 2) {
              uVar35 = uVar28;
              bVar12 = false;
              do {
                bVar11 = bVar12;
                uVar31 = uVar35 & 3;
                uVar35 = uVar35 + 1;
                bVar12 = true;
              } while (uVar31 != 0);
              uVar28 = (-uVar28 & 3) + uVar28;
              if (bVar11) {
                printf("Adjusted the size of segment %d in %s, this is fine, but rare (and may indicate a bigger problem if it happens often)\n"
                       ,uVar32 & 0xffffffff,(local_78->_M_dataplus)._M_p);
              }
            }
            uVar35 = local_70[uVar32 + 3];
            uVar19 = (ulong)uVar35;
            if ((uVar35 & 3) != 0) {
              __assert_fail("(data_ptr % 4) == 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/LinkedObjectFileCreation.cpp"
                            ,0x294,
                            "void link_v3(LinkedObjectFile &, const std::vector<uint8_t> &, const std::string &)"
                           );
            }
            if ((uVar28 & 3) != 0) {
              __assert_fail("(segment_size % 4) == 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/LinkedObjectFileCreation.cpp"
                            ,0x295,
                            "void link_v3(LinkedObjectFile &, const std::vector<uint8_t> &, const std::string &)"
                           );
            }
            puVar26 = (pvVar34->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                      _M_impl.super__Vector_impl_data._M_start;
            uVar25 = (long)(pvVar34->
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                           _M_impl.super__Vector_impl_data._M_finish - (long)puVar26;
            uVar23 = uVar19;
            if (uVar25 <= uVar19) goto LAB_0012d58d;
            uVar35 = uVar35 - 4;
            uVar23 = (ulong)(uVar28 + uVar35);
            if (uVar25 <= uVar23) goto LAB_0012d58d;
            uVar28 = local_70[uVar32];
            uVar30 = (ulong)uVar28;
            local_a0 = uVar19;
            if (puVar26 + uVar19 < puVar26 + uVar23 + 4) {
              puVar33 = puVar26 + (uVar19 - 4);
              do {
                LinkedObjectFile::push_back_word_to_segment
                          (__return_storage_ptr__,*(uint32_t *)(puVar33 + 4),(int)uVar32);
                puVar33 = puVar33 + 4;
              } while (puVar33 < puVar26 + uVar23);
            }
            pvVar34 = local_a8;
            puVar26 = (local_a8->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                      _M_impl.super__Vector_impl_data._M_start;
            uVar25 = (long)(local_a8->
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                           _M_impl.super__Vector_impl_data._M_finish - (long)puVar26;
            uVar23 = uVar30;
            if (uVar25 <= uVar30) goto LAB_0012d58d;
            local_b0 = uVar32;
            if (puVar26[uVar30] != '\0') {
              iVar13 = (int)local_a0;
              uVar32 = 0;
              do {
                puVar26 = (pvVar34->
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
                          .super__Vector_impl_data._M_start;
                uVar25 = (long)(pvVar34->
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                               _M_impl.super__Vector_impl_data._M_finish - (long)puVar26;
                uVar23 = uVar30;
                if ((uVar32 & 1) == 0) {
                  if (uVar25 <= uVar30) goto LAB_0012d58d;
                  uVar35 = uVar35 + (uint)puVar26[uVar30] * 4;
                  puVar27 = &(__return_storage_ptr__->stats).v3_pointer_seeks;
                  *puVar27 = *puVar27 + 1;
                }
                else {
                  local_58 = (int *)CONCAT44(local_58._4_4_,(int)uVar32);
                  if (uVar25 <= uVar30) goto LAB_0012d58d;
                  uVar28 = 0xffffffff;
                  while (uVar28 = uVar28 + 1, uVar28 < puVar26[uVar30]) {
                    puVar27 = &(__return_storage_ptr__->stats).v3_pointers;
                    *puVar27 = *puVar27 + 1;
                    uVar23 = (ulong)uVar35;
                    if (uVar25 <= uVar23) goto LAB_0012d58d;
                    uVar31 = *(uint *)(puVar26 + uVar23);
                    iVar15 = (int)local_b0;
                    if (uVar31 < 0x1000000) {
                      puVar27 = &(__return_storage_ptr__->stats).v3_word_pointers;
                      *puVar27 = *puVar27 + 1;
                      bVar12 = LinkedObjectFile::pointer_link_word
                                         (__return_storage_ptr__,iVar15,-iVar13 + uVar35,iVar15,
                                          uVar31);
                      if (!bVar12) {
                        printf("WARNING bad pointer_link_word (2) in %s\n",
                               (local_78->_M_dataplus)._M_p);
                      }
                    }
                    else {
                      puVar27 = &(__return_storage_ptr__->stats).v3_split_pointers;
                      *puVar27 = *puVar27 + 1;
                      uVar24 = uVar31 >> 0xc & 0xf;
                      if (uVar24 == 0) {
                        __assert_fail("lo_hi_offset",
                                      "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/LinkedObjectFileCreation.cpp"
                                      ,0x2b4,
                                      "void link_v3(LinkedObjectFile &, const std::vector<uint8_t> &, const std::string &)"
                                     );
                      }
                      uVar14 = uVar31 >> 8 & 0xf;
                      if (2 < uVar14) {
                        __assert_fail("dest_seg < 3",
                                      "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/LinkedObjectFileCreation.cpp"
                                      ,0x2b5,
                                      "void link_v3(LinkedObjectFile &, const std::vector<uint8_t> &, const std::string &)"
                                     );
                      }
                      uVar23 = (ulong)(uVar35 + uVar24 * 4);
                      if (uVar25 <= uVar23) goto LAB_0012d58d;
                      iVar16 = -iVar13 + uVar35;
                      LinkedObjectFile::pointer_link_split_word
                                (__return_storage_ptr__,iVar15,iVar16,uVar24 * 4 + iVar16,uVar14,
                                 (uVar31 & 0xff) << 0x10 | (uint)*(ushort *)(puVar26 + uVar23));
                    }
                    uVar35 = uVar35 + 4;
                    puVar26 = (pvVar34->
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                              _M_impl.super__Vector_impl_data._M_start;
                    uVar25 = (long)(pvVar34->
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   )._M_impl.super__Vector_impl_data._M_finish - (long)puVar26;
                    uVar23 = uVar30;
                    if (uVar25 <= uVar30) goto LAB_0012d58d;
                  }
                  uVar32 = (ulong)local_58 & 0xffffffff;
                }
                puVar26 = (pvVar34->
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
                          .super__Vector_impl_data._M_start;
                uVar25 = (long)(pvVar34->
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                               _M_impl.super__Vector_impl_data._M_finish - (long)puVar26;
                uVar23 = uVar30;
                if (uVar25 <= uVar30) goto LAB_0012d58d;
                uVar28 = (int)uVar30 + 1;
                uVar23 = (ulong)uVar28;
                if (puVar26[uVar30] == 0xff) {
                  if (uVar25 <= uVar23) goto LAB_0012d58d;
                  bVar12 = puVar26[uVar23] == '\0';
                  if (bVar12) {
                    uVar23 = (ulong)((int)uVar30 + 2);
                  }
                }
                else {
                  if (uVar25 <= uVar23) goto LAB_0012d58d;
                  bVar12 = true;
                  if (puVar26[uVar23] == '\0') break;
                }
                uVar32 = CONCAT71((int7)(uVar32 >> 8),(byte)uVar32 ^ bVar12);
                uVar30 = uVar23;
              } while( true );
            }
            uVar23 = (ulong)(uVar28 + 1);
            puVar26 = (pvVar34->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                      _M_impl.super__Vector_impl_data._M_start;
            uVar25 = (long)(pvVar34->
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                           _M_impl.super__Vector_impl_data._M_finish - (long)puVar26;
            if (uVar25 <= uVar23) goto LAB_0012d58d;
            while( true ) {
              bVar3 = puVar26[uVar23];
              if (bVar3 == 0) break;
              if ((char)bVar3 < '\0') {
                uVar28 = (uint32_t)uVar23 + 1;
                uVar32 = (ulong)uVar28;
                uVar23 = (ulong)uVar28;
                if (uVar25 <= uVar23) goto LAB_0012d58d;
                pTVar22 = get_type_info();
                puVar33 = puVar26 + uVar23;
                local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
                if (puVar26 == (pointer)0x0) {
                  puVar26 = (pointer)0x1;
                }
                else {
                  sVar21 = strlen((char *)puVar33);
                  puVar26 = puVar33 + sVar21;
                }
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,puVar33,puVar26)
                ;
                TypeInfo::inform_type_method_count(pTVar22,&local_98,bVar3 & 0x7f);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_98._M_dataplus._M_p != &local_98.field_2) {
                  operator_delete(local_98._M_dataplus._M_p,
                                  CONCAT44(local_98.field_2._M_allocated_capacity._4_4_,
                                           local_98.field_2._M_allocated_capacity._0_4_) + 1);
                }
                iVar13 = 1;
              }
              else {
                puVar33 = puVar26 + uVar23;
                iVar13 = 2;
                uVar32 = uVar23;
              }
              local_98.field_2._M_allocated_capacity._0_4_ = 0x706d655f;
              local_98._M_string_length = 7;
              local_98.field_2._M_allocated_capacity._4_4_ = 0x5f7974;
              local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
              iVar15 = std::__cxx11::string::compare((char *)&local_98);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_98._M_dataplus._M_p != &local_98.field_2) {
                operator_delete(local_98._M_dataplus._M_p,
                                CONCAT44(local_98.field_2._M_allocated_capacity._4_4_,
                                         local_98.field_2._M_allocated_capacity._0_4_) + 1);
              }
              if (iVar15 == 0) {
                iVar13 = 0;
              }
              if (((char)bVar3 < '\0') && (iVar15 == 0)) {
                __assert_fail("kind == SymbolLinkKind::SYMBOL",
                              "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/LinkedObjectFileCreation.cpp"
                              ,0x2ec,
                              "void link_v3(LinkedObjectFile &, const std::vector<uint8_t> &, const std::string &)"
                             );
              }
              sVar21 = strlen((char *)puVar33);
              puVar27 = &(__return_storage_ptr__->stats).v3_symbol_count;
              *puVar27 = *puVar27 + 1;
              pTVar22 = get_type_info();
              std::__cxx11::string::string((string *)&local_98,(char *)puVar33,&local_b1);
              TypeInfo::inform_symbol_with_no_type_info(pTVar22,&local_98);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_98._M_dataplus._M_p != &local_98.field_2) {
                operator_delete(local_98._M_dataplus._M_p,
                                CONCAT44(local_98.field_2._M_allocated_capacity._4_4_,
                                         local_98.field_2._M_allocated_capacity._0_4_) + 1);
              }
              uVar28 = (int)uVar32 + (int)sVar21 + 1;
              sVar21 = local_a0;
              do {
                puVar26 = (local_a8->
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
                          .super__Vector_impl_data._M_start;
                uVar25 = (long)(local_a8->
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                               _M_impl.super__Vector_impl_data._M_finish - (long)puVar26;
                do {
                  uVar35 = uVar28;
                  uVar23 = (ulong)uVar35;
                  if (uVar25 <= uVar23) goto LAB_0012d58d;
                  uVar28 = uVar35 + 1;
                  uVar31 = (int)sVar21 + (uint)puVar26[uVar23] * 4;
                  sVar21 = (size_t)uVar31;
                } while (puVar26[uVar23] == 0xff);
                uVar23 = sVar21;
                if (uVar25 <= sVar21) goto LAB_0012d58d;
                if (*(int *)(puVar26 + sVar21) == -1) {
                  puVar27 = &(__return_storage_ptr__->stats).v3_symbol_link_word;
                  *puVar27 = *puVar27 + 1;
                  if (iVar13 == 0) {
                    kind = EMPTY_PTR;
                  }
                  else {
                    kind = SYM_PTR;
                    if (iVar13 == 1) {
                      pTVar22 = get_type_info();
                      std::__cxx11::string::string((string *)&local_98,(char *)puVar33,&local_b1);
                      TypeInfo::inform_type(pTVar22,&local_98);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_98._M_dataplus._M_p != &local_98.field_2) {
                        operator_delete(local_98._M_dataplus._M_p,
                                        CONCAT44(local_98.field_2._M_allocated_capacity._4_4_,
                                                 local_98.field_2._M_allocated_capacity._0_4_) + 1);
                      }
                      kind = TYPE_PTR;
                    }
                  }
                  LinkedObjectFile::symbol_link_word
                            (__return_storage_ptr__,(int)local_b0,uVar31 - (int)local_a0,
                             (char *)puVar33,kind);
                }
                else {
                  puVar27 = &(__return_storage_ptr__->stats).v3_symbol_link_offset;
                  *puVar27 = *puVar27 + 1;
                  if (iVar13 != 2) {
                    __assert_fail("kind == SymbolLinkKind::SYMBOL",
                                  "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/LinkedObjectFileCreation.cpp"
                                  ,200,
                                  "uint32_t c_symlink3(LinkedObjectFile &, const std::vector<uint8_t> &, uint32_t, uint32_t, SymbolLinkKind, const char *, int)"
                                 );
                  }
                  LinkedObjectFile::symbol_link_offset
                            (__return_storage_ptr__,(int)local_b0,uVar31 - (int)local_a0,
                             (char *)puVar33);
                }
                uVar23 = (ulong)uVar28;
                puVar26 = (local_a8->
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
                          .super__Vector_impl_data._M_start;
                uVar25 = (long)(local_a8->
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                               _M_impl.super__Vector_impl_data._M_finish - (long)puVar26;
                if (uVar25 <= uVar23) goto LAB_0012d58d;
              } while (puVar26[uVar23] != '\0');
              uVar23 = (ulong)(uVar35 + 2);
              pvVar34 = local_a8;
              if (uVar25 <= uVar23) goto LAB_0012d58d;
            }
            local_4c[local_b0] = (uint32_t)uVar23;
            uVar25 = local_b0;
          }
          uVar32 = uVar25 - 1;
          if (uVar25 == 0) {
            if (local_70[0] != 0x80) {
              __assert_fail("segment_link_offsets[0] == 128",
                            "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/LinkedObjectFileCreation.cpp"
                            ,0x2f7,
                            "void link_v3(LinkedObjectFile &, const std::vector<uint8_t> &, const std::string &)"
                           );
            }
            if (local_40[0x16] == 0) {
              if (local_70[1] != 0x82) {
                __assert_fail("segment_link_offsets[0] + 2 == segment_link_offsets[1]",
                              "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/LinkedObjectFileCreation.cpp"
                              ,0x2fc,
                              "void link_v3(LinkedObjectFile &, const std::vector<uint8_t> &, const std::string &)"
                             );
              }
            }
            else if (local_4c[0] + 1 != local_70[1]) {
              __assert_fail("segment_link_ends[0] + 1 == segment_link_offsets[1]",
                            "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/LinkedObjectFileCreation.cpp"
                            ,0x2fa,
                            "void link_v3(LinkedObjectFile &, const std::vector<uint8_t> &, const std::string &)"
                           );
            }
            if (local_40[0x1a] == 0) {
              if (local_70[1] + 2 != local_70[2]) {
                __assert_fail("segment_link_offsets[1] + 2 == segment_link_offsets[2]",
                              "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/LinkedObjectFileCreation.cpp"
                              ,0x302,
                              "void link_v3(LinkedObjectFile &, const std::vector<uint8_t> &, const std::string &)"
                             );
              }
            }
            else if (local_4c[1] + 1 != local_70[2]) {
              __assert_fail("segment_link_ends[1] + 1 == segment_link_offsets[2]",
                            "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/LinkedObjectFileCreation.cpp"
                            ,0x300,
                            "void link_v3(LinkedObjectFile &, const std::vector<uint8_t> &, const std::string &)"
                           );
            }
            if ((local_4c[2] + 0x11 & 0xfffffff0) == local_70[3]) {
              return __return_storage_ptr__;
            }
            __assert_fail("align16(segment_link_ends[2] + 2) == segment_data_offsets[0]",
                          "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/LinkedObjectFileCreation.cpp"
                          ,0x305,
                          "void link_v3(LinkedObjectFile &, const std::vector<uint8_t> &, const std::string &)"
                         );
          }
        } while( true );
      }
    }
    uVar25 = 0;
    uVar23 = 0;
  }
LAB_0012d58d:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar23,
             uVar25);
}

Assistant:

LinkedObjectFile to_linked_object_file(const std::vector<uint8_t>& data, const std::string& name) {
  LinkedObjectFile result;
  const auto* header = (const LinkHeaderCommon*)&data.at(0);

  // use appropriate linker
  if (header->version == 3) {
    assert(header->type_tag == 0);
    link_v3(result, data, name);
  } else if (header->version == 4) {
    assert(header->type_tag == 0xffffffff);
    link_v4(result, data, name);
  } else if (header->version == 5) {
    link_v5(result, data, name);
  } else {
    assert(false);
  }

  return result;
}